

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSParserImpl::endElement
          (DOMLSParserImpl *this,XMLElementDecl *elemDecl,uint urlId,bool isRoot,XMLCh *elemPrefix)

{
  DOMNode *key;
  bool bVar1;
  uint uVar2;
  FilterAction FVar3;
  int iVar4;
  FilterAction *pFVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  DOMNode *pDVar7;
  DOMLSException *this_00;
  DOMNode *pDVar8;
  long *plVar9;
  undefined4 extraout_var_01;
  
  if (((this->fFilter != (DOMLSParserFilter *)0x0) &&
      (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) &&
     (bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                        (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode)
     , bVar1)) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
              (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  AbstractDOMParser::endElement(&this->super_AbstractDOMParser,elemDecl,urlId,isRoot,elemPrefix);
  if (this->fFilter != (DOMLSParserFilter *)0x0) {
    uVar2 = (*this->fFilter->_vptr_DOMLSParserFilter[4])();
    if ((uVar2 & 1) == 0) {
      return;
    }
    key = (this->super_AbstractDOMParser).fCurrentNode;
    if ((this->fFilterAction ==
         (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
         0x0) || (bVar1 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                          ::containsKey(this->fFilterAction,key), !bVar1)) {
      FVar3 = (*this->fFilter->_vptr_DOMLSParserFilter[2])(this->fFilter,key);
    }
    else {
      pFVar5 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
               ::get(this->fFilterAction,key,XMLPlatformUtils::fgMemoryManager);
      FVar3 = *pFVar5;
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
      removeKey(this->fFilterAction,key);
    }
    if (FVar3 != FILTER_REJECT) {
      if (FVar3 != FILTER_SKIP) {
        if (FVar3 != FILTER_INTERRUPT) {
          return;
        }
        this_00 = (DOMLSException *)__cxa_allocate_exception(0x28);
        DOMLSException::DOMLSException
                  (this_00,0x51,0x22,(this->super_AbstractDOMParser).fMemoryManager);
        __cxa_throw(this_00,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
      }
      iVar4 = (*key->_vptr_DOMNode[7])(key);
      plVar9 = (long *)CONCAT44(extraout_var,iVar4);
      while (plVar9 != (long *)0x0) {
        plVar6 = (long *)(**(code **)(*plVar9 + 0x50))(plVar9);
        pDVar7 = (this->super_AbstractDOMParser).fCurrentParent;
        (*pDVar7->_vptr_DOMNode[0x11])(pDVar7,plVar9);
        plVar9 = plVar6;
      }
    }
    iVar4 = (*key->_vptr_DOMNode[9])(key);
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      pDVar7 = (this->super_AbstractDOMParser).fCurrentParent;
      pDVar8 = pDVar7;
    }
    else {
      iVar4 = (*key->_vptr_DOMNode[9])(key);
      pDVar7 = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
      pDVar8 = (this->super_AbstractDOMParser).fCurrentParent;
    }
    (this->super_AbstractDOMParser).fCurrentNode = pDVar7;
    (*pDVar8->_vptr_DOMNode[0x10])(pDVar8,key);
    (*key->_vptr_DOMNode[0x27])(key);
    return;
  }
  return;
}

Assistant:

void DOMLSParserImpl::endElement(const XMLElementDecl& elemDecl
                               , const unsigned int    urlId
                               , const bool            isRoot
                               , const XMLCh* const    elemPrefix)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::endElement(elemDecl, urlId, isRoot, elemPrefix);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_ELEMENT)
        {
            DOMNode* thisNode = fCurrentNode;
            DOMLSParserFilter::FilterAction action;
            if(fFilterAction && fFilterAction->containsKey(thisNode))
            {
                action = fFilterAction->get(thisNode);
                fFilterAction->removeKey(thisNode);
            }
            else
                action = fFilter->acceptNode(thisNode);
            switch(action)
            {
            case DOMLSParserFilter::FILTER_ACCEPT:      break;
            case DOMLSParserFilter::FILTER_REJECT:      fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                        fCurrentParent->removeChild(thisNode);
                                                        thisNode->release();
                                                        break;
            case DOMLSParserFilter::FILTER_SKIP:        {
                                                            DOMNode* child=thisNode->getFirstChild();
                                                            while(child)
                                                            {
                                                                DOMNode* next=child->getNextSibling();
                                                                fCurrentParent->appendChild(child);
                                                                child=next;
                                                            }
                                                            fCurrentNode = (thisNode->getPreviousSibling()?thisNode->getPreviousSibling():fCurrentParent);
                                                            fCurrentParent->removeChild(thisNode);
                                                            thisNode->release();
                                                        }
                                                        break;
            case DOMLSParserFilter::FILTER_INTERRUPT:   throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingAborted, fMemoryManager);
            }
        }
    }
}